

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestRefcounting(void)

{
  TemplateCachePeer TVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Template *tpl;
  TemplateCacheKey key;
  TemplateCacheKey key_00;
  TemplateCacheKey key_01;
  TemplateCacheKey key_02;
  TemplateCacheKey key_03;
  TemplateCacheKey key_04;
  TemplateCacheKey key_05;
  TemplateCacheKey key_06;
  TemplateCacheKey key_07;
  TemplateCacheKey key_08;
  TemplateCacheKey key_09;
  TemplateCacheKey key_10;
  TemplateCacheKey key_11;
  TemplateCacheKey key_12;
  TemplateCacheKey key_13;
  TemplateCacheKey key_14;
  TemplateCacheKey key_15;
  TemplateCacheKey key_16;
  TemplateCacheKey key_17;
  TemplateCacheKey key_18;
  TemplateCacheKey key_19;
  TemplateCacheKey key_20;
  TemplateCacheKey key_21;
  TemplateCacheKey key_22;
  TemplateCacheKey key_23;
  TemplateCacheKey key_24;
  TemplateCacheKey key_25;
  TemplateCacheKey key_26;
  TemplateCacheKey key_27;
  TemplateCacheKey key_28;
  TemplateCacheKey key_29;
  TemplateCacheKey key_30;
  TemplateCacheKey key_31;
  TemplateCacheKey key_32;
  TemplateCacheKey key_33;
  TemplateCacheKey key_34;
  int old_delete_count;
  TemplateString local_438;
  long local_418;
  Template *cache2_tpl2_post_reload;
  string local_408 [32];
  TemplateString local_3e8;
  Template *local_3c8;
  Template *cache2_tpl1_post_reload;
  string local_3b8 [32];
  Template *local_398;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  Template *local_388;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  Template *local_378;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  Template *local_368;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  unsigned_long local_358;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  unsigned_long local_348;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  unsigned_long local_338;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  unsigned_long local_328;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  TemplateString local_318;
  long local_2f8;
  Template *cache2_tpl2;
  Template *local_2d0;
  Template *cache2_tpl1;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  Template *local_2b8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  Template *local_2a8;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  Template *local_298;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  unsigned_long local_288;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  unsigned_long local_278;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  unsigned_long local_268;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  unsigned_long local_258;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  TemplateCachePeer local_248;
  TemplateCachePeer cache_peer2;
  TemplateCache *cache2;
  undefined4 uStack_230;
  undefined4 uStack_220;
  undefined1 auStack_218 [8];
  TemplateCacheKey cache_key2;
  undefined4 uStack_200;
  undefined4 uStack_1f0;
  undefined1 auStack_1e0 [8];
  TemplateCacheKey cache_key1;
  Template *cache1_tpl2;
  Template *local_188;
  Template *cache1_tpl1;
  string local_178 [32];
  ctemplate local_158 [8];
  string filename2;
  allocator local_131;
  string local_130 [32];
  ctemplate local_110 [8];
  string filename1;
  TemplateString local_f0;
  TemplateDictionary local_d0 [8];
  TemplateDictionary dict;
  TemplateCachePeer local_50;
  TemplateCachePeer cache_peer;
  TemplateCache cache1;
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)&cache_peer);
  ctemplate::TemplateCachePeer::TemplateCachePeer(&local_50,(TemplateCache *)&cache_peer);
  ctemplate::TemplateString::TemplateString(&local_f0,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_d0,&local_f0,(UnsafeArena *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"{valid template}",&local_131);
  ctemplate::StringToTemplateFile(local_110,(string *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_178,"{another valid template}",(allocator *)((long)&cache1_tpl1 + 7));
  ctemplate::StringToTemplateFile(local_158,(string *)local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cache1_tpl1 + 7));
  ctemplate::TemplateString::TemplateString((TemplateString *)&cache1_tpl2,(string *)local_110);
  local_188 = (Template *)
              ctemplate::TemplateCache::GetTemplate
                        ((TemplateString *)&cache_peer,(Strip)&cache1_tpl2);
  if (local_188 == (Template *)0x0) {
    __assert_fail("cache1_tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x25c,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&cache_key1.super_TemplateCacheKey.second,(string *)local_158);
  lVar4 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache_peer,(int)&cache_key1 + 8);
  if (lVar4 == 0) {
    __assert_fail("cache1_tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x25f,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  ctemplate::TemplateCachePeer::TemplateCacheKey::TemplateCacheKey
            ((TemplateCacheKey *)auStack_1e0,(string *)local_110,2);
  uStack_1f0 = (undefined4)cache_key1.super_TemplateCacheKey.first;
  key.super_TemplateCacheKey.second = uStack_1f0;
  key.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
  key.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key);
  if (iVar2 != 2) {
    printf("ASSERT FAILED, line %d: %s\n",0x264,"cache_peer.Refcount(cache_key1) == 2");
    cache_key2.super_TemplateCacheKey._8_8_ = auStack_1e0;
    uStack_200 = (undefined4)cache_key1.super_TemplateCacheKey.first;
    key_00.super_TemplateCacheKey.second = uStack_200;
    key_00.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
    key_00.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_00);
    if (iVar2 == 2) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key1) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x264,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  ctemplate::TemplateCachePeer::TemplateCacheKey::TemplateCacheKey
            ((TemplateCacheKey *)auStack_218,(string *)local_158,2);
  uStack_220 = (undefined4)cache_key2.super_TemplateCacheKey.first;
  key_01.super_TemplateCacheKey.second = uStack_220;
  key_01.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
  key_01.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_01);
  if (iVar2 != 2) {
    printf("ASSERT FAILED, line %d: %s\n",0x266,"cache_peer.Refcount(cache_key2) == 2");
    uStack_230 = (undefined4)cache_key2.super_TemplateCacheKey.first;
    key_02.super_TemplateCacheKey.second = uStack_230;
    key_02.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
    key_02.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_02);
    if (iVar2 == 2) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key2) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x266,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  cache_peer2.cache_ = (TemplateCache *)ctemplate::TemplateCache::Clone();
  ctemplate::TemplateCachePeer::TemplateCachePeer(&local_248,cache_peer2.cache_);
  local_258 = (unsigned_long)auStack_1e0;
  uStack_250 = (undefined4)cache_key1.super_TemplateCacheKey.first;
  uStack_24c = (undefined4)(cache_key1.super_TemplateCacheKey.first >> 0x20);
  key_03.super_TemplateCacheKey.second = uStack_250;
  key_03.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
  key_03.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_03);
  if (iVar2 != 3) {
    printf("ASSERT FAILED, line %d: %s\n",0x26d,"cache_peer.Refcount(cache_key1) == 3");
    local_268 = (unsigned_long)auStack_1e0;
    uStack_260 = (undefined4)cache_key1.super_TemplateCacheKey.first;
    uStack_25c = (undefined4)(cache_key1.super_TemplateCacheKey.first >> 0x20);
    key_04.super_TemplateCacheKey.second = uStack_260;
    key_04.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
    key_04.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_04);
    if (iVar2 == 3) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key1) == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x26d,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_278 = (unsigned_long)auStack_1e0;
  uStack_270 = (undefined4)cache_key1.super_TemplateCacheKey.first;
  uStack_26c = (undefined4)(cache_key1.super_TemplateCacheKey.first >> 0x20);
  key_05.super_TemplateCacheKey.second = uStack_270;
  key_05.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
  key_05.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_05);
  if (iVar2 != 3) {
    printf("ASSERT FAILED, line %d: %s\n",0x26e,"cache_peer2.Refcount(cache_key1) == 3");
    local_288 = (unsigned_long)auStack_1e0;
    uStack_280 = (undefined4)cache_key1.super_TemplateCacheKey.first;
    uStack_27c = (undefined4)(cache_key1.super_TemplateCacheKey.first >> 0x20);
    key_06.super_TemplateCacheKey.second = uStack_280;
    key_06.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
    key_06.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_06);
    if (iVar2 == 3) {
      exit(1);
    }
    __assert_fail("cache_peer2.Refcount(cache_key1) == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x26e,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_298 = (Template *)auStack_218;
  uStack_290 = (undefined4)cache_key2.super_TemplateCacheKey.first;
  uStack_28c = (undefined4)(cache_key2.super_TemplateCacheKey.first >> 0x20);
  key_07.super_TemplateCacheKey.second = uStack_290;
  key_07.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
  key_07.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_07);
  if (iVar2 != 3) {
    printf("ASSERT FAILED, line %d: %s\n",0x26f,"cache_peer.Refcount(cache_key2) == 3");
    local_2a8 = (Template *)auStack_218;
    uStack_2a0 = (undefined4)cache_key2.super_TemplateCacheKey.first;
    uStack_29c = (undefined4)(cache_key2.super_TemplateCacheKey.first >> 0x20);
    key_08.super_TemplateCacheKey.second = uStack_2a0;
    key_08.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
    key_08.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_08);
    if (iVar2 == 3) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key2) == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x26f,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_2b8 = (Template *)auStack_218;
  uStack_2b0 = (undefined4)cache_key2.super_TemplateCacheKey.first;
  uStack_2ac = (undefined4)(cache_key2.super_TemplateCacheKey.first >> 0x20);
  key_09.super_TemplateCacheKey.second = uStack_2b0;
  key_09.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
  key_09.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_09);
  TVar1 = cache_peer2;
  if (iVar2 != 3) {
    printf("ASSERT FAILED, line %d: %s\n",0x270,"cache_peer2.Refcount(cache_key2) == 3");
    cache2_tpl1 = (Template *)auStack_218;
    uStack_2c0 = (undefined4)cache_key2.super_TemplateCacheKey.first;
    uStack_2bc = (undefined4)(cache_key2.super_TemplateCacheKey.first >> 0x20);
    key_10.super_TemplateCacheKey.second = uStack_2c0;
    key_10.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
    key_10.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_10);
    if (iVar2 == 3) {
      exit(1);
    }
    __assert_fail("cache_peer2.Refcount(cache_key2) == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x270,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&cache2_tpl2,(string *)local_110);
  local_2d0 = (Template *)
              ctemplate::TemplateCache::GetTemplate
                        ((TemplateString *)TVar1.cache_,(Strip)&cache2_tpl2);
  TVar1 = cache_peer2;
  ctemplate::TemplateString::TemplateString(&local_318,(string *)local_158);
  local_2f8 = ctemplate::TemplateCache::GetTemplate
                        ((TemplateString *)TVar1.cache_,(Strip)&local_318);
  if (local_2d0 != local_188) {
    printf("ASSERT FAILED, line %d: %s\n",0x277,"cache2_tpl1 == cache1_tpl1");
    if (local_2d0 == local_188) {
      exit(1);
    }
    __assert_fail("cache2_tpl1 == cache1_tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x277,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  if (local_2f8 != lVar4) {
    printf("ASSERT FAILED, line %d: %s\n",0x278,"cache2_tpl2 == cache1_tpl2");
    if (local_2f8 == lVar4) {
      exit(1);
    }
    __assert_fail("cache2_tpl2 == cache1_tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x278,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_328 = (unsigned_long)auStack_1e0;
  uStack_320 = (undefined4)cache_key1.super_TemplateCacheKey.first;
  uStack_31c = (undefined4)(cache_key1.super_TemplateCacheKey.first >> 0x20);
  key_11.super_TemplateCacheKey.second = uStack_320;
  key_11.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
  key_11.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_11);
  if (iVar2 != 4) {
    printf("ASSERT FAILED, line %d: %s\n",0x27b,"cache_peer.Refcount(cache_key1) == 4");
    local_338 = (unsigned_long)auStack_1e0;
    uStack_330 = (undefined4)cache_key1.super_TemplateCacheKey.first;
    uStack_32c = (undefined4)(cache_key1.super_TemplateCacheKey.first >> 0x20);
    key_12.super_TemplateCacheKey.second = uStack_330;
    key_12.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
    key_12.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_12);
    if (iVar2 == 4) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key1) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x27b,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_348 = (unsigned_long)auStack_1e0;
  uStack_340 = (undefined4)cache_key1.super_TemplateCacheKey.first;
  uStack_33c = (undefined4)(cache_key1.super_TemplateCacheKey.first >> 0x20);
  key_13.super_TemplateCacheKey.second = uStack_340;
  key_13.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
  key_13.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_13);
  if (iVar2 != 4) {
    printf("ASSERT FAILED, line %d: %s\n",0x27c,"cache_peer2.Refcount(cache_key1) == 4");
    local_358 = (unsigned_long)auStack_1e0;
    uStack_350 = (undefined4)cache_key1.super_TemplateCacheKey.first;
    uStack_34c = (undefined4)(cache_key1.super_TemplateCacheKey.first >> 0x20);
    key_14.super_TemplateCacheKey.second = uStack_350;
    key_14.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
    key_14.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_14);
    if (iVar2 == 4) {
      exit(1);
    }
    __assert_fail("cache_peer2.Refcount(cache_key1) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x27c,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_368 = (Template *)auStack_218;
  uStack_360 = (undefined4)cache_key2.super_TemplateCacheKey.first;
  uStack_35c = (undefined4)(cache_key2.super_TemplateCacheKey.first >> 0x20);
  key_15.super_TemplateCacheKey.second = uStack_360;
  key_15.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
  key_15.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_15);
  if (iVar2 != 4) {
    printf("ASSERT FAILED, line %d: %s\n",0x27d,"cache_peer.Refcount(cache_key2) == 4");
    local_378 = (Template *)auStack_218;
    uStack_370 = (undefined4)cache_key2.super_TemplateCacheKey.first;
    uStack_36c = (undefined4)(cache_key2.super_TemplateCacheKey.first >> 0x20);
    key_16.super_TemplateCacheKey.second = uStack_370;
    key_16.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
    key_16.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_16);
    if (iVar2 == 4) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key2) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x27d,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_388 = (Template *)auStack_218;
  uStack_380 = (undefined4)cache_key2.super_TemplateCacheKey.first;
  uStack_37c = (undefined4)(cache_key2.super_TemplateCacheKey.first >> 0x20);
  key_17.super_TemplateCacheKey.second = uStack_380;
  key_17.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
  key_17.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_17);
  if (iVar2 != 4) {
    printf("ASSERT FAILED, line %d: %s\n",0x27e,"cache_peer2.Refcount(cache_key2) == 4");
    local_398 = (Template *)auStack_218;
    uStack_390 = (undefined4)cache_key2.super_TemplateCacheKey.first;
    uStack_38c = (undefined4)(cache_key2.super_TemplateCacheKey.first >> 0x20);
    key_18.super_TemplateCacheKey.second = uStack_390;
    key_18.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
    key_18.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_18);
    if (iVar2 == 4) {
      exit(1);
    }
    __assert_fail("cache_peer2.Refcount(cache_key2) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x27e,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b8,"{file1 contents changed}",(allocator *)((long)&cache2_tpl1_post_reload + 7))
  ;
  ctemplate::StringToFile((string *)local_3b8,(string *)local_110);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cache2_tpl1_post_reload + 7));
  ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)cache_peer2.cache_);
  TVar1 = cache_peer2;
  ctemplate::TemplateString::TemplateString(&local_3e8,(string *)local_110);
  tpl = (Template *)
        ctemplate::TemplateCache::GetTemplate((TemplateString *)TVar1.cache_,(Strip)&local_3e8);
  local_3c8 = tpl;
  if (tpl == local_2d0) {
    printf("ASSERT FAILED, line %d: %s\n",0x288,"cache2_tpl1_post_reload != cache2_tpl1");
    if (local_3c8 != local_2d0) {
      exit(1);
    }
    __assert_fail("cache2_tpl1_post_reload != cache2_tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x288,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_408,"{file1 contents changed}",(allocator *)((long)&cache2_tpl2_post_reload + 7))
  ;
  ctemplate::AssertExpandIs(tpl,local_d0,(string *)local_408,true);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cache2_tpl2_post_reload + 7));
  TVar1 = cache_peer2;
  ctemplate::TemplateString::TemplateString(&local_438,(string *)local_158);
  local_418 = ctemplate::TemplateCache::GetTemplate
                        ((TemplateString *)TVar1.cache_,(Strip)&local_438);
  if (local_418 != local_2f8) {
    printf("ASSERT FAILED, line %d: %s\n",0x290,"cache2_tpl2_post_reload == cache2_tpl2");
    if (local_418 == local_2f8) {
      exit(1);
    }
    __assert_fail("cache2_tpl2_post_reload == cache2_tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x290,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  key_19.super_TemplateCacheKey.second = (undefined4)cache_key1.super_TemplateCacheKey.first;
  key_19.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
  key_19.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_19);
  if (iVar2 != 3) {
    printf("ASSERT FAILED, line %d: %s\n",0x299,"cache_peer.Refcount(cache_key1) == 3");
    key_20.super_TemplateCacheKey.second = (undefined4)cache_key1.super_TemplateCacheKey.first;
    key_20.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
    key_20.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_20);
    if (iVar2 == 3) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key1) == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x299,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  key_21.super_TemplateCacheKey.second = (undefined4)cache_key1.super_TemplateCacheKey.first;
  key_21.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
  key_21.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_21);
  if (iVar2 != 2) {
    printf("ASSERT FAILED, line %d: %s\n",0x29a,"cache_peer2.Refcount(cache_key1) == 2");
    key_22.super_TemplateCacheKey.second = (undefined4)cache_key1.super_TemplateCacheKey.first;
    key_22.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
    key_22.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_22);
    if (iVar2 == 2) {
      exit(1);
    }
    __assert_fail("cache_peer2.Refcount(cache_key1) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x29a,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  key_23.super_TemplateCacheKey.second = (undefined4)cache_key2.super_TemplateCacheKey.first;
  key_23.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
  key_23.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_23);
  if (iVar2 != 5) {
    printf("ASSERT FAILED, line %d: %s\n",0x29b,"cache_peer.Refcount(cache_key2) == 5");
    key_24.super_TemplateCacheKey.second = (undefined4)cache_key2.super_TemplateCacheKey.first;
    key_24.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
    key_24.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_24);
    if (iVar2 == 5) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key2) == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x29b,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  key_25.super_TemplateCacheKey.second = (undefined4)cache_key2.super_TemplateCacheKey.first;
  key_25.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
  key_25.super_TemplateCacheKey._12_4_ = 0;
  iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_25);
  if (iVar2 != 5) {
    printf("ASSERT FAILED, line %d: %s\n",0x29c,"cache_peer2.Refcount(cache_key2) == 5");
    key_26.super_TemplateCacheKey.second = (undefined4)cache_key2.super_TemplateCacheKey.first;
    key_26.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
    key_26.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_26);
    if (iVar2 == 5) {
      exit(1);
    }
    __assert_fail("cache_peer2.Refcount(cache_key2) == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x29c,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  iVar2 = ctemplate::TemplateCachePeer::NumTotalTemplateDeletes();
  ctemplate::TemplateCachePeer::DoneWithGetTemplatePtrs(&local_248);
  key_27.super_TemplateCacheKey.second = (undefined4)cache_key1.super_TemplateCacheKey.first;
  key_27.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
  key_27.super_TemplateCacheKey._12_4_ = 0;
  iVar3 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_27);
  if (iVar3 != 2) {
    printf("ASSERT FAILED, line %d: %s\n",0x2a5,"cache_peer.Refcount(cache_key1) == 2");
    key_28.super_TemplateCacheKey.second = (undefined4)cache_key1.super_TemplateCacheKey.first;
    key_28.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
    key_28.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_28);
    if (iVar2 == 2) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key1) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x2a5,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  key_29.super_TemplateCacheKey.second = (undefined4)cache_key1.super_TemplateCacheKey.first;
  key_29.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
  key_29.super_TemplateCacheKey._12_4_ = 0;
  iVar3 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_29);
  if (iVar3 != 1) {
    printf("ASSERT FAILED, line %d: %s\n",0x2a6,"cache_peer2.Refcount(cache_key1) == 1");
    key_30.super_TemplateCacheKey.second = (undefined4)cache_key1.super_TemplateCacheKey.first;
    key_30.super_TemplateCacheKey.first = (unsigned_long)auStack_1e0;
    key_30.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_30);
    if (iVar2 == 1) {
      exit(1);
    }
    __assert_fail("cache_peer2.Refcount(cache_key1) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x2a6,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  key_31.super_TemplateCacheKey.second = (undefined4)cache_key2.super_TemplateCacheKey.first;
  key_31.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
  key_31.super_TemplateCacheKey._12_4_ = 0;
  iVar3 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_31);
  if (iVar3 != 3) {
    printf("ASSERT FAILED, line %d: %s\n",0x2a7,"cache_peer.Refcount(cache_key2) == 3");
    key_32.super_TemplateCacheKey.second = (undefined4)cache_key2.super_TemplateCacheKey.first;
    key_32.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
    key_32.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_50,key_32);
    if (iVar2 == 3) {
      exit(1);
    }
    __assert_fail("cache_peer.Refcount(cache_key2) == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x2a7,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  key_33.super_TemplateCacheKey.second = (undefined4)cache_key2.super_TemplateCacheKey.first;
  key_33.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
  key_33.super_TemplateCacheKey._12_4_ = 0;
  iVar3 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_33);
  if (iVar3 != 3) {
    printf("ASSERT FAILED, line %d: %s\n",0x2a8,"cache_peer2.Refcount(cache_key2) == 3");
    key_34.super_TemplateCacheKey.second = (undefined4)cache_key2.super_TemplateCacheKey.first;
    key_34.super_TemplateCacheKey.first = (unsigned_long)auStack_218;
    key_34.super_TemplateCacheKey._12_4_ = 0;
    iVar2 = ctemplate::TemplateCachePeer::Refcount(&local_248,key_34);
    if (iVar2 == 3) {
      exit(1);
    }
    __assert_fail("cache_peer2.Refcount(cache_key2) == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x2a8,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  ctemplate::TemplateCachePeer::ClearCache(&local_50);
  iVar3 = ctemplate::TemplateCachePeer::NumTotalTemplateDeletes();
  if (iVar3 != iVar2 + 1) {
    printf("ASSERT FAILED, line %d: %s\n",0x2ad,
           "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 1");
    iVar3 = ctemplate::TemplateCachePeer::NumTotalTemplateDeletes();
    if (iVar3 == iVar2 + 1) {
      exit(1);
    }
    __assert_fail("cache_peer.NumTotalTemplateDeletes() == old_delete_count + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x2ad,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  ctemplate::TemplateCachePeer::ClearCache(&local_248);
  iVar3 = ctemplate::TemplateCachePeer::NumTotalTemplateDeletes();
  TVar1 = cache_peer2;
  if (iVar3 == iVar2 + 3) {
    if (cache_peer2.cache_ != (TemplateCache *)0x0) {
      ctemplate::TemplateCache::~TemplateCache(cache_peer2.cache_);
      operator_delete(TVar1.cache_);
    }
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_110);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_d0);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)&cache_peer);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x2b0,
         "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 3");
  iVar3 = ctemplate::TemplateCachePeer::NumTotalTemplateDeletes();
  if (iVar3 == iVar2 + 3) {
    exit(1);
  }
  __assert_fail("cache_peer.NumTotalTemplateDeletes() == old_delete_count + 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                ,0x2b0,"static void TemplateCacheUnittest::TestRefcounting()");
}

Assistant:

static void TestRefcounting() {
    TemplateCache cache1;
    TemplateCachePeer cache_peer(&cache1);
    TemplateDictionary dict("dict");

    // Add templates
    string filename1 = StringToTemplateFile("{valid template}");
    string filename2 = StringToTemplateFile("{another valid template}");

    const Template* cache1_tpl1 = cache1.GetTemplate(filename1,
                                                     STRIP_WHITESPACE);
    assert(cache1_tpl1);
    const Template* cache1_tpl2 = cache1.GetTemplate(filename2,
                                                     STRIP_WHITESPACE);
    assert(cache1_tpl2);

    // Check refcount.  It should be 2 -- one for the originalvalue
    // when it's constructed, and one for the call to GetTemplate.
    TemplateCachePeer::TemplateCacheKey cache_key1(filename1, STRIP_WHITESPACE);
    ASSERT(cache_peer.Refcount(cache_key1) == 2);
    TemplateCachePeer::TemplateCacheKey cache_key2(filename2, STRIP_WHITESPACE);
    ASSERT(cache_peer.Refcount(cache_key2) == 2);

    // Clone cache2 from cache1
    TemplateCache* cache2 = cache1.Clone();
    TemplateCachePeer cache_peer2(cache2);

    // Check refcount was incremented.  It should be the same for both caches.
    ASSERT(cache_peer.Refcount(cache_key1) == 3);
    ASSERT(cache_peer2.Refcount(cache_key1) == 3);
    ASSERT(cache_peer.Refcount(cache_key2) == 3);
    ASSERT(cache_peer2.Refcount(cache_key2) == 3);

    // Check that the template ptrs in both caches are the same.
    const Template* cache2_tpl1 = cache2->GetTemplate(filename1,
                                                      STRIP_WHITESPACE);
    const Template* cache2_tpl2 = cache2->GetTemplate(filename2,
                                                      STRIP_WHITESPACE);
    ASSERT(cache2_tpl1 == cache1_tpl1);
    ASSERT(cache2_tpl2 == cache1_tpl2);

    // GetTemplate should have augmented the refcount.
    ASSERT(cache_peer.Refcount(cache_key1) == 4);
    ASSERT(cache_peer2.Refcount(cache_key1) == 4);
    ASSERT(cache_peer.Refcount(cache_key2) == 4);
    ASSERT(cache_peer2.Refcount(cache_key2) == 4);

    // Change tpl1 file contents and reload.
    StringToFile("{file1 contents changed}", filename1);
    cache2->ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    // Since the template will be reloaded into a new instance,
    // GetTemplate will return new pointers. The older template
    // pointer was moved to the freelist.
    const Template* cache2_tpl1_post_reload = cache2->GetTemplate(
        filename1, STRIP_WHITESPACE);
    ASSERT(cache2_tpl1_post_reload != cache2_tpl1);
    // Check that cache1's tpl1 has the new contents
    AssertExpandIs(cache2_tpl1_post_reload, &dict, "{file1 contents changed}",
                   true);

    // Ensure tpl2 is unchanged
    const Template* cache2_tpl2_post_reload = cache2->GetTemplate(
        filename2, STRIP_WHITESPACE);
    ASSERT(cache2_tpl2_post_reload == cache2_tpl2);

    // Now key1 points to different templates in cache1 and cache2.
    // cache1's version should have a refcount of 3 (was 4, went down
    // by 1 when cache2 dropped its reference to it).  cache2's
    // version should be 2 (one for the new file, 1 for the call to
    // GetTemplate() that followed it), while key2 should have a
    // refcount of 5 in both caches (due to the new call, above, to
    // GetTemplate()).
    ASSERT(cache_peer.Refcount(cache_key1) == 3);
    ASSERT(cache_peer2.Refcount(cache_key1) == 2);
    ASSERT(cache_peer.Refcount(cache_key2) == 5);
    ASSERT(cache_peer2.Refcount(cache_key2) == 5);

    const int old_delete_count = cache_peer.NumTotalTemplateDeletes();

    // Clear up the cache2's freelist, this should drop all refcounts,
    // due to the calls cache_peer2 made to
    // GetTemplate(the-old-filename1), GetTemplate(the-new-filename1),
    // and GetTemplate(filename2) (twice!)
    cache_peer2.DoneWithGetTemplatePtrs();
    ASSERT(cache_peer.Refcount(cache_key1) == 2);
    ASSERT(cache_peer2.Refcount(cache_key1) == 1);
    ASSERT(cache_peer.Refcount(cache_key2) == 3);
    ASSERT(cache_peer2.Refcount(cache_key2) == 3);

    // Make sure that deleting from the cache causes deletion.
    // ClearCache() on peer1 should finally get rid of the old filename1.
    cache_peer.ClearCache();
    ASSERT(cache_peer.NumTotalTemplateDeletes() == old_delete_count + 1);
    cache_peer2.ClearCache();
    // Delete-count should go up by 2 as both the new tpl1, and tpl2, go away.
    ASSERT(cache_peer.NumTotalTemplateDeletes() == old_delete_count + 3);

    delete cache2;
  }